

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_for_update.c
# Opt level: O0

lu_int basiclu_solve_for_update
                 (lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                 lu_int *Wi,double *Wx,lu_int nzrhs,lu_int *irhs,double *xrhs,lu_int *p_nzlhs,
                 lu_int *ilhs,double *lhs,char trans)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  lu_int *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  lu_int ok;
  lu_int n;
  lu_int status;
  lu this;
  undefined1 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd01;
  undefined1 in_stack_fffffffffffffd02;
  bool bVar2;
  undefined1 in_stack_fffffffffffffd03;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  int iVar3;
  lu_int *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd18;
  lu_int *in_stack_fffffffffffffd20;
  lu *in_stack_fffffffffffffd28;
  double *in_stack_fffffffffffffd40;
  lu_int *in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  int local_29c;
  int local_28c;
  int local_288;
  lu_int *in_stack_fffffffffffffe88;
  lu_int *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  lu_int *in_stack_fffffffffffffea0;
  lu_int in_stack_fffffffffffffeac;
  lu *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffed0;
  char in_stack_fffffffffffffed8;
  lu_int local_4;
  
  local_4 = lu_load(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd10,
                    (double *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    (lu_int *)
                    CONCAT44(in_stack_fffffffffffffd04,
                             CONCAT13(in_stack_fffffffffffffd03,
                                      CONCAT12(in_stack_fffffffffffffd02,
                                               CONCAT11(in_stack_fffffffffffffd01,
                                                        in_stack_fffffffffffffd00)))),
                    in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
  if (local_4 == 0) {
    if (((((in_RDX == 0) || (in_RCX == 0)) || (in_R8 == 0)) ||
        ((in_R9 == 0 || (in_stack_00000008 == 0)))) ||
       ((in_stack_00000010 == 0 || (_n == (int *)0x0)))) {
      iVar3 = -3;
    }
    else if (((this.reltol._0_1_ == 't') || (this.reltol._0_1_ == 'T')) || (this._0_8_ != 0)) {
      if (local_28c < 0) {
        iVar3 = -2;
      }
      else if (local_288 == local_29c) {
        iVar3 = -5;
      }
      else {
        if ((this.reltol._0_1_ == 't') || (this.reltol._0_1_ == 'T')) {
          bVar2 = false;
          if (-1 < *_n) {
            bVar2 = *_n < local_29c;
          }
        }
        else {
          bVar2 = -1 < in_stack_00000018 && in_stack_00000018 <= local_29c;
          for (iVar3 = 0; iVar3 < in_stack_00000018 && bVar2; iVar3 = iVar3 + 1) {
            bVar1 = false;
            if ((bVar2) && (bVar1 = false, -1 < _n[iVar3])) {
              bVar1 = _n[iVar3] < local_29c;
            }
            bVar2 = bVar1;
          }
        }
        iVar3 = 0;
        if (!bVar2) {
          iVar3 = -4;
        }
      }
    }
    else {
      iVar3 = -3;
    }
    if (iVar3 == 0) {
      iVar3 = lu_solve_for_update(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                                  in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                  in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                  in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    }
    local_4 = lu_save(&stack0xfffffffffffffd10,in_RDI,in_RSI,iVar3);
  }
  return local_4;
}

Assistant:

lu_int basiclu_solve_for_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int nzrhs,
    const lu_int irhs[],
    const double xrhs[],
    lu_int *p_nzlhs,
    lu_int ilhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status, n, ok;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && irhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (trans != 't' && trans != 'T' && !xrhs)
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else if (this.nforrest == this.m)
    {
        status = BASICLU_ERROR_maximum_updates;
    }
    else
    {
        /* check RHS indices */
        if (trans == 't' || trans == 'T')
        {
            ok = irhs[0] >= 0 && irhs[0] < this.m;
        }
        else
        {
            ok = nzrhs >= 0 && nzrhs <= this.m;
            for (n = 0; n < nzrhs && ok; n++)
            {
                ok = ok && irhs[n] >= 0 && irhs[n] < this.m;
            }
        }
        if (!ok)
            status = BASICLU_ERROR_invalid_argument;
    }

    if (status == BASICLU_OK)
    {
        /* may request reallocation */
        status = lu_solve_for_update(&this, nzrhs, irhs, xrhs, p_nzlhs, ilhs,
                                     lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}